

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode JsDiagGetBreakpoints(JsValueRef *breakpoints)

{
  JsrtRuntime *this;
  bool bVar1;
  JsErrorCode JVar2;
  int iVar3;
  JsrtContext *pJVar4;
  JsrtDebugManager *this_00;
  ScriptContext *pSVar5;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_80 [8];
  EnterScriptObject __enterScriptObject;
  ThreadContextScope scope;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar4 = JsrtContext::GetCurrent();
  JVar2 = CheckContext(pJVar4,false,false);
  if (JVar2 == JsNoError) {
    pSVar5 = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_b8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_80,pSVar5,(ScriptEntryExitRecord *)auStack_b8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(pSVar5,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_80);
    if (breakpoints == (JsValueRef *)0x0) {
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_80);
      JVar2 = JsErrorNullArgument;
    }
    else {
      *breakpoints = (JsValueRef)0x0;
      pJVar4 = JsrtContext::GetCurrent();
      this = (pJVar4->runtime).ptr;
      ThreadContextScope::ThreadContextScope
                ((ThreadContextScope *)&__enterScriptObject.library,this->threadContext);
      JVar2 = JsErrorWrongThread;
      if (__enterScriptObject.library._1_1_ == '\x01') {
        this_00 = JsrtRuntime::GetJsrtDebugManager(this);
        JVar2 = JsErrorDiagNotInDebugMode;
        if ((this_00 != (JsrtDebugManager *)0x0) &&
           (bVar1 = JsrtDebugManager::IsDebugEventCallbackSet(this_00), bVar1)) {
          scope.originalContext =
               (ThreadContext *)
               Js::JavascriptLibrary::CreateArray
                         ((((((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                            scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary);
          pSVar5 = this->threadContext->scriptContextList;
          if (pSVar5 != (ScriptContext *)0x0) {
            do {
              iVar3 = (*(pSVar5->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar5);
              if ((char)iVar3 != '\0') break;
              JsrtDebugManager::GetBreakpoints
                        (this_00,(JavascriptArray **)&scope.originalContext,pSVar5);
              pSVar5 = pSVar5->next;
            } while (pSVar5 != (ScriptContext *)0x0);
          }
          *breakpoints = scope.originalContext;
          JVar2 = JsNoError;
        }
      }
      ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&__enterScriptObject.library);
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_80);
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  }
  return JVar2;
}

Assistant:

CHAKRA_API JsDiagGetBreakpoints(
    _Out_ JsValueRef *breakpoints)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(breakpoints);
        *breakpoints = JS_INVALID_REFERENCE;

        JsrtContext* currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        ThreadContextScope scope(runtime->GetThreadContext());

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();
        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        Js::JavascriptArray* bpsArray = currentContext->GetScriptContext()->GetLibrary()->CreateArray();

        for (Js::ScriptContext* currentScriptContext = runtime->GetThreadContext()->GetScriptContextList();
            currentScriptContext != nullptr && !currentScriptContext->IsClosed();
            currentScriptContext = currentScriptContext->next)
        {
            jsrtDebugManager->GetBreakpoints(&bpsArray, currentScriptContext);
        }

        *breakpoints = bpsArray;
        return JsNoError;
    });
#endif
}